

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  pointer piVar2;
  UnitTestImpl *pUVar3;
  bool bVar4;
  OsStackTraceGetterInterface *pOVar5;
  long lVar6;
  pointer ppTVar7;
  long lVar8;
  uint uVar9;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  pUVar3 = UnitTest::GetInstance::instance.impl_;
  (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar5 = (OsStackTraceGetterInterface *)operator_new(8);
    pOVar5->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_002d1568;
    pUVar3->os_stack_trace_getter_ = pOVar5;
  }
  (*pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x25f6b6,(char *)0x0);
  lVar6 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar6 / 1000000;
  lVar6 = std::chrono::_V2::steady_clock::now();
  ppTVar7 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7) >> 3)) {
    lVar8 = 1;
    do {
      piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0xffffffff;
      if (lVar8 + -1 <
          (long)(int)((ulong)((long)(this->test_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) {
        uVar9 = piVar2[lVar8 + -1];
      }
      TestInfo::Run(ppTVar7[uVar9]);
      if (FLAGS_gtest_fail_fast == '\x01') {
        piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0xffffffff;
        if (lVar8 + -1 <
            (long)(int)((ulong)((long)(this->test_indices_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) {
          uVar9 = piVar2[lVar8 + -1];
        }
        bVar4 = TestResult::Failed(&(this->test_info_list_).
                                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9]->result_);
        if (bVar4) goto LAB_00244cce;
      }
      ppTVar7 = (this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = lVar8 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7
                                   ) >> 3);
      lVar8 = lVar8 + 1;
    } while (bVar4);
  }
LAB_00244ce2:
  lVar8 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar8 - lVar6) / 1000000;
  if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar5 = (OsStackTraceGetterInterface *)operator_new(8);
    pOVar5->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_002d1568;
    pUVar3->os_stack_trace_getter_ = pOVar5;
  }
  (*pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x25f6c8,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  pUVar3->current_test_suite_ = (TestSuite *)0x0;
  return;
LAB_00244cce:
  for (; ppTVar7 = (this->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar8 <
      (int)((ulong)((long)(this->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7) >> 3);
      lVar8 = lVar8 + 1) {
    piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0xffffffff;
    if (lVar8 < (int)((ulong)((long)(this->test_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) {
      uVar9 = piVar2[lVar8];
    }
    TestInfo::Skip(ppTVar7[uVar9]);
  }
  goto LAB_00244ce2;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
    if (GTEST_FLAG(fail_fast) && GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}